

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void __thiscall NetworkNS::Network::Network(Network *this,NetwMin *netw_min,string *filename)

{
  list<sNode,_std::allocator<sNode>_> *this_00;
  list<sStrand,_std::allocator<sStrand>_> *this_01;
  size_t *psVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  iterator __position;
  pointer psVar8;
  long *plVar9;
  double dVar10;
  byte bVar11;
  pointer pbVar12;
  undefined8 uVar13;
  char cVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  tNode *temp;
  undefined4 extraout_var;
  ostream *poVar20;
  _Node *p_Var21;
  _Node *p_Var22;
  _List_node_base *p_Var23;
  _List_node_base *p_Var24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  pointer plVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  pointer pcVar34;
  pointer pcVar35;
  double dyr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_of_file;
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  chains;
  double dzr;
  ifstream data_file;
  long local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  ulong local_450;
  ulong local_448;
  long local_440;
  Network *local_438;
  undefined8 local_430;
  vector<sBead_type,_std::allocator<sBead_type>_> *local_428;
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  *local_420;
  size_t *local_418;
  vector<sBond_type,_std::allocator<sBond_type>_> *local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  pointer piStack_3c8;
  pointer piStack_3c0;
  pointer local_3b8;
  pointer ppsStack_3b0;
  pointer local_3a8;
  pointer ppsStack_3a0;
  pointer local_398;
  pointer piStack_390;
  pointer local_388;
  pointer ppsStack_380;
  pointer local_378;
  pointer ppsStack_370;
  int local_368;
  undefined1 local_360 [16];
  double local_350;
  double local_348;
  list<sStrand_*,_std::allocator<sStrand_*>_> *local_338;
  long local_330;
  double local_328;
  NetwMin *local_320;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  this->_vptr_Network = (_func_int **)&PTR__Network_0010fd58;
  this_00 = &this->nodes;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node._M_size = 0;
  this_01 = &this->strands;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node._M_size = 0;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->subchains;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->subchains;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_338 = &this->pslip_springs;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_338;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_338;
  local_428 = &this->node_types;
  local_410 = &this->bond_types;
  local_420 = &this->sorted_chains;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438 = this;
  local_320 = netw_min;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: Initializing network.\n",0x19);
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  uVar16 = local_430._4_4_;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418 = (size_t *)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_440 = 2;
  lVar33 = 0;
  local_498 = 0;
  lVar31 = 0;
  lVar26 = 0;
  local_330 = 2;
  local_430 = (ulong)local_430._4_4_ << 0x20;
  local_450 = 0;
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_450 = 0;
    local_430 = (ulong)uVar16 << 0x20;
    iVar18 = 0;
    iVar19 = 0;
    local_440 = 0;
    iVar25 = 0;
    iVar17 = 0;
    iVar32 = 0;
    local_448 = local_448 & 0xffffffff00000000;
    iVar30 = 0;
    do {
      local_3e8._0_8_ = &local_3d8;
      local_3e8._8_8_ = (pointer)0x0;
      local_3d8._M_allocated_capacity = local_3d8._M_allocated_capacity & 0xffffffffffffff00;
      cVar14 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)local_3e8,cVar14);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_408,(value_type *)local_3e8);
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca15,0);
      if (lVar26 != -1) {
        iVar15 = atoi((char *)local_3e8._0_8_);
        local_450 = CONCAT44(extraout_var,iVar15);
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca1b,0);
      if (lVar26 != -1) {
        iVar15 = atoi((char *)local_3e8._0_8_);
        local_430 = CONCAT44(local_430._4_4_,iVar15);
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca21,0);
      if (lVar26 != -1) {
        iVar18 = iVar30;
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca27,0);
      if (lVar26 != -1) {
        iVar19 = iVar30;
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca2d,0);
      if (lVar26 != -1) {
        iVar25 = iVar30;
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca34,0);
      if (lVar26 != -1) {
        lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca39,0);
        iVar15 = (int)local_440;
        if (lVar26 != -1) {
          iVar15 = iVar30;
        }
        local_440 = CONCAT44(local_440._4_4_,iVar15);
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca40,0);
      if ((lVar26 != -1) &&
         (lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca39,0), lVar26 != -1)) {
        iVar17 = iVar30;
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca45,0);
      if ((lVar26 != -1) &&
         (lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca4a,0), lVar26 != -1)) {
        iVar32 = iVar30;
      }
      lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca50,0);
      if (lVar26 != -1) {
        lVar26 = std::__cxx11::string::find((char *)local_3e8,0x10ca4a,0);
        iVar15 = (int)local_448;
        if (lVar26 != -1) {
          iVar15 = iVar30;
        }
        local_448 = CONCAT44(local_448._4_4_,iVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._0_8_ != &local_3d8) {
        operator_delete((void *)local_3e8._0_8_,local_3d8._M_allocated_capacity + 1);
      }
      iVar30 = iVar30 + 1;
    } while (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0);
    lVar33 = (long)iVar32;
    lVar31 = (long)iVar25;
    local_498 = (long)iVar17;
    local_418 = (size_t *)(long)(int)local_448;
    lVar26 = (long)(int)local_440;
    local_330 = (long)(iVar18 + 2);
    local_440 = (long)(iVar19 + 2);
  }
  std::ifstream::close();
  pcVar34 = local_408.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar33]._M_dataplus._M_p;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar34,
             pcVar34 + local_408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar33]._M_string_length);
  tokenize(&local_468,&local_258);
  local_3d8._M_allocated_capacity =
       (size_type)
       local_488.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3e8._8_8_ =
       local_488.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3e8._0_8_ =
       local_488.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_468.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_468.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_468.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  uVar16 = atoi((char *)((local_488.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: --- Number of bead types: ",0x1d);
  poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," .\n",3);
  std::vector<sBead_type,_std::allocator<sBead_type>_>::resize(local_428,(long)(int)uVar16);
  if (0 < (int)uVar16) {
    local_498 = local_498 << 5;
    lVar31 = lVar31 << 5;
    local_448 = (ulong)uVar16 * 0x18;
    uVar27 = 0;
    do {
      lVar33 = *(long *)((long)&local_408.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p +
                        lVar31);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,lVar33,
                 *(long *)((long)&local_408.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length +
                          lVar31) + lVar33);
      tokenize(&local_468,&local_2f8);
      local_3d8._M_allocated_capacity =
           (size_type)
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3e8._8_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3e8._0_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      pbVar12 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar10 = atof((char *)local_488.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      psVar5 = (local_428->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)&psVar5->n_mass + uVar27) = dVar10;
      dVar10 = atof((char *)pbVar12[2]._M_dataplus._M_p);
      *(double *)((long)&psVar5->mass + uVar27) = dVar10;
      lVar33 = *(long *)((long)&local_408.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p +
                        local_498);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,lVar33,
                 *(long *)((long)&local_408.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length +
                          local_498) + lVar33);
      tokenize(&local_468,&local_278);
      local_3d8._M_allocated_capacity =
           (size_type)
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3e8._8_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3e8._0_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      dVar10 = atof((char *)local_488.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      *(double *)
       ((long)&((local_428->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
                super__Vector_impl_data._M_start)->r_node + uVar27) = dVar10;
      local_498 = local_498 + 0x20;
      lVar31 = lVar31 + 0x20;
      uVar27 = uVar27 + 0x18;
    } while (local_448 != uVar27);
  }
  pcVar34 = local_408.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)local_418]._M_dataplus._M_p;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar34,
             pcVar34 + local_408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)local_418]._M_string_length);
  tokenize(&local_468,&local_298);
  local_3d8._M_allocated_capacity =
       (size_type)
       local_488.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3e8._8_8_ =
       local_488.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3e8._0_8_ =
       local_488.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_468.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_468.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_468.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  uVar16 = atoi((char *)((local_488.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: --- Number of bond types: ",0x1d);
  poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," .\n",3);
  std::vector<sBond_type,_std::allocator<sBond_type>_>::resize(local_410,(long)(int)uVar16);
  if (0 < (int)uVar16) {
    lVar26 = lVar26 * 0x20 + 0x48;
    lVar31 = 0;
    do {
      lVar33 = *(long *)((long)local_408.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,lVar33,
                 *(long *)((long)&((local_408.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar26) + lVar33);
      tokenize(&local_468,&local_2b8);
      local_3d8._M_allocated_capacity =
           (size_type)
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3e8._8_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3e8._0_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      pbVar12 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar10 = atof((char *)local_488.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      psVar6 = (local_410->super__Vector_base<sBond_type,_std::allocator<sBond_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)&psVar6->spring_coeff + lVar31) = dVar10;
      dVar10 = atof((char *)pbVar12[2]._M_dataplus._M_p);
      *(double *)((long)&psVar6->sq_ete + lVar31) = dVar10;
      dVar10 = atof((char *)pbVar12[3]._M_dataplus._M_p);
      *(double *)((long)&psVar6->kuhnl + lVar31) = dVar10;
      lVar26 = lVar26 + 0x20;
      lVar31 = lVar31 + 0x18;
    } while ((ulong)uVar16 * 0x18 != lVar31);
  }
  if (0 < (int)local_450) {
    uVar27 = local_450 & 0xffffffff;
    lVar26 = local_330 << 5;
    do {
      lVar31 = *(long *)((long)&((local_408.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar26);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,lVar31,
                 *(long *)((long)&(local_408.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                          lVar26) + lVar31);
      tokenize(&local_468,&local_2d8);
      local_3d8._M_allocated_capacity =
           (size_type)
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3e8._8_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3e8._0_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      pbVar12 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_378 = (pointer)0x0;
      ppsStack_370 = (pointer)0x0;
      local_388 = (pointer)0x0;
      ppsStack_380 = (pointer)0x0;
      local_398 = (pointer)0x0;
      piStack_390 = (pointer)0x0;
      local_3a8 = (pointer)0x0;
      ppsStack_3a0 = (pointer)0x0;
      local_3b8 = (pointer)0x0;
      ppsStack_3b0 = (pointer)0x0;
      piStack_3c8 = (pointer)0x0;
      piStack_3c0 = (pointer)0x0;
      iVar17 = atoi((char *)((local_488.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      local_3e8._0_4_ = iVar17;
      iVar17 = atoi((char *)pbVar12[2]._M_dataplus._M_p);
      local_3e8._4_4_ = iVar17;
      local_3e8._8_8_ = atof((char *)pbVar12[4]._M_dataplus._M_p);
      local_3d8._M_allocated_capacity = (size_type)atof((char *)pbVar12[5]._M_dataplus._M_p);
      local_3d8._8_8_ = atof((char *)pbVar12[6]._M_dataplus._M_p);
      local_368 = 0;
      psVar7 = (local_428->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar5 = psVar7 + (long)iVar17 + -1;
      uVar3 = psVar5->mass;
      uVar4 = psVar5->n_mass;
      local_360._8_4_ = (int)uVar3;
      local_360._0_8_ = uVar4;
      local_360._12_4_ = (int)((ulong)uVar3 >> 0x20);
      local_350 = psVar7[(long)iVar17 + -1].r_node;
      local_348 = local_350;
      p_Var21 = std::__cxx11::list<sNode,std::allocator<sNode>>::_M_create_node<sNode_const&>
                          ((list<sNode,std::allocator<sNode>> *)this_00,(sNode *)local_3e8);
      std::__detail::_List_node_base::_M_hook(&p_Var21->super__List_node_base);
      psVar1 = &(local_438->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      if (ppsStack_380 != (pointer)0x0) {
        operator_delete(ppsStack_380,(long)ppsStack_370 - (long)ppsStack_380);
      }
      if (local_398 != (pointer)0x0) {
        operator_delete(local_398,(long)local_388 - (long)local_398);
      }
      if (ppsStack_3b0 != (pointer)0x0) {
        operator_delete(ppsStack_3b0,(long)ppsStack_3a0 - (long)ppsStack_3b0);
      }
      if (piStack_3c8 != (pointer)0x0) {
        operator_delete(piStack_3c8,(long)local_3b8 - (long)piStack_3c8);
      }
      lVar26 = lVar26 + 0x20;
      uVar27 = uVar27 - 1;
    } while (uVar27 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#: --- ",7);
  poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_450);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar20," nodes have been added to the network structure.\n",0x31);
  uVar27 = 0;
  if ((int)local_430 < 1) {
    uVar27 = 0;
  }
  else {
    local_418 = &(local_438->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>.
                 _M_impl._M_node._M_size;
    local_448 = local_430 & 0xffffffff;
    uVar28 = 0;
    do {
      uVar2 = local_440 + uVar28;
      pcVar34 = local_408.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_dataplus._M_p;
      local_430 = uVar2;
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,pcVar34,
                 pcVar34 + local_408.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_string_length);
      tokenize(&local_468,&local_318);
      local_3d8._M_allocated_capacity =
           (size_type)
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3e8._8_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3e8._0_8_ =
           local_488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      pbVar12 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_3b8 = (pointer)0x0;
      ppsStack_3b0 = (pointer)0x0;
      local_3a8 = (pointer)0x0;
      iVar17 = atoi((char *)((local_488.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      local_3e8._0_4_ = iVar17;
      iVar17 = atoi((char *)pbVar12[1]._M_dataplus._M_p);
      local_3e8._4_4_ = iVar17;
      uVar16 = atoi((char *)pbVar12[5]._M_dataplus._M_p);
      if ((int)uVar27 < (int)uVar16) {
        uVar27 = (ulong)uVar16;
      }
      local_3e8[0xc] = uVar16 == 0;
      local_3e8._8_4_ = uVar16;
      iVar18 = atoi((char *)pbVar12[2]._M_dataplus._M_p);
      iVar19 = atoi((char *)pbVar12[3]._M_dataplus._M_p);
      if (((int)local_450 < iVar18) || ((int)local_450 < iVar19)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,": --- There is a problem at line: ",0x22);
        poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_430 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," of the data file.\n",0x13);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,local_408.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_dataplus.
                                     _M_p,
                             local_408.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_string_length);
        std::operator<<(poVar20,"\n");
        exit(0);
      }
      p_Var24 = (this_00->super__List_base<sNode,_std::allocator<sNode>_>)._M_impl._M_node.
                super__List_node_base._M_next;
      bVar11 = uVar16 == 0;
      if (p_Var24 != (_List_node_base *)this_00) {
        iVar17 = 0;
        do {
          if ((*(int *)&p_Var24[1]._M_next == iVar18) || (*(int *)&p_Var24[1]._M_next == iVar19)) {
            __position._M_current = (int *)p_Var24[3]._M_prev;
            if ((_List_node_base *)__position._M_current == p_Var24[4]._M_next) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)(p_Var24 + 3),__position,
                         (int *)(local_3e8 + 8));
            }
            else {
              *__position._M_current = local_3e8._8_4_;
              p_Var24[3]._M_prev = (_List_node_base *)(__position._M_current + 1);
            }
            local_468.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var24 + 1);
            std::vector<sNode*,std::allocator<sNode*>>::emplace_back<sNode*>
                      ((vector<sNode*,std::allocator<sNode*>> *)&local_3b8,(sNode **)&local_468);
            iVar17 = iVar17 + 1;
          }
          p_Var24 = p_Var24->_M_next;
        } while ((p_Var24 != (_List_node_base *)this_00) && (iVar17 < 2));
        iVar17 = local_3e8._4_4_;
        bVar11 = local_3e8[0xc];
      }
      psVar8 = (local_410->super__Vector_base<sBond_type,_std::allocator<sBond_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar6 = psVar8 + (long)iVar17 + -1;
      local_3d8._8_8_ = psVar6->spring_coeff;
      piStack_3c8 = (pointer)psVar6->sq_ete;
      piStack_3c0 = (pointer)psVar8[(long)iVar17 + -1].kuhnl;
      if ((bVar11 & 1) != 0) {
        local_3d8._M_allocated_capacity = local_3d8._M_allocated_capacity & 0xffffffff00000000;
      }
      p_Var22 = std::__cxx11::list<sStrand,std::allocator<sStrand>>::_M_create_node<sStrand_const&>
                          ((list<sStrand,std::allocator<sStrand>> *)this_01,(sStrand *)local_3e8);
      std::__detail::_List_node_base::_M_hook(&p_Var22->super__List_node_base);
      psVar1 = &(local_438->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((bool)local_3e8[0xc] == true) {
        p_Var24 = (local_438->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl.
                  _M_node.super__List_node_base._M_prev;
        p_Var23 = (_List_node_base *)operator_new(0x18);
        p_Var23[1]._M_next = p_Var24 + 1;
        std::__detail::_List_node_base::_M_hook(p_Var23);
        *local_418 = *local_418 + 1;
      }
      if (local_3b8 != (pointer)0x0) {
        operator_delete(local_3b8,(long)local_3a8 - (long)local_3b8);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != local_448);
  }
  p_Var24 = (this_01->super__List_base<sStrand,_std::allocator<sStrand>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var24 != (_List_node_base *)this_01) {
    do {
      if (*(undefined1 *)((long)&p_Var24[1]._M_prev + 4) == '\0') {
        local_3e8._0_8_ = p_Var24 + 1;
        std::vector<sStrand*,std::allocator<sStrand*>>::emplace_back<sStrand*>
                  ((vector<sStrand*,std::allocator<sStrand*>> *)
                   ((long)(p_Var24[4]._M_next)->_M_next + 0x38),(sStrand **)local_3e8);
        local_3e8._0_8_ = p_Var24 + 1;
        std::vector<sStrand*,std::allocator<sStrand*>>::emplace_back<sStrand*>
                  ((vector<sStrand*,std::allocator<sStrand*>> *)
                   ((long)((p_Var24[4]._M_next)->_M_prev + 3) + 8),(sStrand **)local_3e8);
      }
      p_Var24 = p_Var24->_M_next;
    } while (p_Var24 != (_List_node_base *)this_01);
    p_Var24 = (this_01->super__List_base<sStrand,_std::allocator<sStrand>_>)._M_impl._M_node.
              super__List_node_base._M_next;
  }
  if (p_Var24 != (_List_node_base *)this_01) {
    do {
      if (*(undefined1 *)((long)&p_Var24[1]._M_prev + 4) == '\0') {
        lVar26 = (long)(p_Var24[4]._M_next)->_M_next;
        p_Var23 = (p_Var24[4]._M_next)->_M_prev;
        local_3e8._0_8_ = (double)p_Var23->_M_prev - *(double *)(lVar26 + 8);
        local_468.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((double)p_Var23[1]._M_next - *(double *)(lVar26 + 0x10));
        local_328 = (double)*(_List_node_base **)((long)(p_Var23 + 1) + 8) -
                    *(double *)(lVar26 + 0x18);
        Domain::minimum_image(local_320->domain,(double *)local_3e8,(double *)&local_468,&local_328)
        ;
        dVar10 = SQRT(local_328 * local_328 +
                      (double)local_3e8._0_8_ * (double)local_3e8._0_8_ +
                      (double)local_468.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start *
                      (double)local_468.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        if (0.0001 < dVar10 - (double)p_Var24[3]._M_next / (double)p_Var24[3]._M_prev) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Strand ",7);
          poVar20 = (ostream *)
                    std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var24[1]._M_next);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," has length ",0xc);
          poVar20 = std::ostream::_M_insert<double>
                              ((double)p_Var24[3]._M_next / (double)p_Var24[3]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," but real dist ",0xf);
          poVar20 = std::ostream::_M_insert<double>(dVar10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
          std::ostream::put((char)poVar20);
          std::ostream::flush();
        }
      }
      p_Var24 = p_Var24->_M_next;
    } while (p_Var24 != (_List_node_base *)this_01);
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::vector((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
            *)local_3e8,uVar27,(allocator_type *)&local_468);
  for (p_Var24 = (this_01->super__List_base<sStrand,_std::allocator<sStrand>_>)._M_impl._M_node.
                 super__List_node_base._M_next; uVar13 = local_3e8._0_8_,
      p_Var24 != (_List_node_base *)this_01; p_Var24 = p_Var24->_M_next) {
    if (*(undefined1 *)((long)&p_Var24[1]._M_prev + 4) == '\0') {
      iVar17 = *(int *)&p_Var24[1]._M_prev;
      p_Var23 = (_List_node_base *)operator_new(0x18);
      p_Var23[1]._M_next = p_Var24 + 1;
      std::__detail::_List_node_base::_M_hook(p_Var23);
      *(long *)(uVar13 + (long)iVar17 * 0x18 + -8) =
           *(long *)(uVar13 + (long)iVar17 * 0x18 + -8) + 1;
    }
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::resize(local_420,uVar27);
  if (local_3e8._8_8_ != local_3e8._0_8_) {
    uVar27 = 0;
    do {
      pcVar34 = (pointer)(local_3e8._0_8_ + uVar27 * 0x18);
      pcVar35 = *(pointer *)pcVar34;
      while (((pcVar35 != pcVar34 &&
              (*(int *)(**(long **)(*(long *)(pcVar35 + 0x10) + 0x30) + 4) != 1)) &&
             (*(int *)((*(long **)(*(long *)(pcVar35 + 0x10) + 0x30))[1] + 4) != 1))) {
        pcVar35 = *(pointer *)pcVar35;
      }
      if (pcVar35 == pcVar34) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Chain with no ends was found: ",0x1e);
        poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," .\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Number of strands: ",0x13);
        poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," .\n",3);
        break;
      }
      plVar9 = *(long **)(*(long *)(pcVar35 + 0x10) + 0x30);
      lVar26 = *plVar9;
      if (*(int *)(lVar26 + 4) != 1) {
        *plVar9 = plVar9[1];
        *(long *)(*(long *)(*(long *)(pcVar35 + 0x10) + 0x30) + 8) = lVar26;
      }
      plVar29 = (local_420->
                super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      p_Var24 = (_List_node_base *)operator_new(0x18);
      lVar26 = uVar27 * 0x18;
      p_Var24[1]._M_next = *(_List_node_base **)(pcVar35 + 0x10);
      std::__detail::_List_node_base::_M_hook(p_Var24);
      psVar1 = (size_t *)
               ((long)&plVar29[uVar27].super__List_base<sStrand_*,_std::allocator<sStrand_*>_>.
                       _M_impl._M_node + 0x10);
      *psVar1 = *psVar1 + 1;
      uVar28 = uVar27;
      if (1 < *(ulong *)(local_3e8._0_8_ + lVar26 + 0x10)) {
        *(ulong *)(local_3e8._0_8_ + lVar26 + 0x10) =
             *(ulong *)(local_3e8._0_8_ + lVar26 + 0x10) - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pcVar35,0x18);
        iVar17 = *(int *)(local_3e8._0_8_ + uVar27 * 0x18 + 0x10);
        if (0 < iVar17) {
          iVar18 = 0;
          local_450 = uVar27;
          do {
            plVar29 = (local_420->
                      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pcVar34 = (pointer)(local_3e8._0_8_ + lVar26);
            do {
              pcVar34 = *(pointer *)pcVar34;
              if (pcVar34 == (pointer)(local_3e8._0_8_ + lVar26)) goto LAB_001092fa;
              plVar9 = *(long **)(*(long *)(pcVar34 + 0x10) + 0x30);
              p_Var24 = (_List_node_base *)*plVar9;
              p_Var23 = ((*(_List_node_base **)
                           ((long)&plVar29[uVar27].
                                   super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl.
                                   _M_node + 8))[1]._M_next[3]._M_next)->_M_prev;
              if (p_Var24 == p_Var23) {
                p_Var24 = (_List_node_base *)operator_new(0x18);
                p_Var24[1]._M_next = *(_List_node_base **)(pcVar34 + 0x10);
                goto LAB_001092ce;
              }
            } while ((_List_node_base *)plVar9[1] != p_Var23);
            *plVar9 = plVar9[1];
            *(_List_node_base **)(*(long *)(*(long *)(pcVar34 + 0x10) + 0x30) + 8) = p_Var24;
            plVar29 = (local_420->
                      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            p_Var24 = (_List_node_base *)operator_new(0x18);
            p_Var24[1]._M_next = *(_List_node_base **)(pcVar34 + 0x10);
LAB_001092ce:
            std::__detail::_List_node_base::_M_hook(p_Var24);
            psVar1 = (size_t *)
                     ((long)&plVar29[uVar27].super__List_base<sStrand_*,_std::allocator<sStrand_*>_>
                             ._M_impl._M_node + 0x10);
            *psVar1 = *psVar1 + 1;
            *(long *)(local_3e8._0_8_ + lVar26 + 0x10) =
                 *(long *)(local_3e8._0_8_ + lVar26 + 0x10) + -1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(pcVar34,0x18);
LAB_001092fa:
            iVar18 = iVar18 + 1;
            uVar28 = local_450;
          } while (iVar18 != iVar17);
        }
      }
      uVar27 = (ulong)((int)uVar28 + 1);
      uVar28 = ((long)(local_3e8._8_8_ - local_3e8._0_8_) >> 3) * -0x5555555555555555;
    } while (uVar27 <= uVar28 && uVar28 - uVar27 != 0);
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::~vector((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
             *)local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Network::Network(class NetwMin *netw_min, std::string filename) {

      int nnodes = 0, nstrands = 0, atoms_line_start = 0, bonds_line_start = 0,
              bond_coeffs_line_start = 0, masses_line_start = 0, pair_coeffs_line_start = 0,
              atom_types_line = 0, bond_types_line = 0, ihelp;

      nstrands = 0;
      cout << "#: Initializing network.\n";
      /* Define and open the desired file. */
      ifstream data_file(filename.c_str(), ifstream::in);
      /* Define an array of strings to hold the contents of the file. */
      std::vector <string> lines_of_file;
      std::vector <string> tokens;

      /* Read and search file. */
      int iline = 0;

      while (data_file.good()) {
         /* A temporary string for the current line of the file. */
         std::string current_line;
         getline(data_file, current_line);
         /* Add current line to file's array of lines. */
         lines_of_file.push_back(current_line);

         if (current_line.find("atoms") != string::npos)
            nnodes = atoi(current_line.c_str());
         if (current_line.find("bonds") != string::npos)
            nstrands = atoi(current_line.c_str());
         if (current_line.find("Atoms") != string::npos)
            atoms_line_start = iline;
         if (current_line.find("Bonds") != string::npos)
            bonds_line_start = iline;
         if (current_line.find("Masses") != string::npos)
            masses_line_start = iline;
         if ((current_line.find("Bond") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            bond_coeffs_line_start = iline;
         if ((current_line.find("Pair") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            pair_coeffs_line_start = iline;
         if ((current_line.find("atom") != string::npos)
                 && (current_line.find("types") != string::npos))
            atom_types_line = iline;
         if ((current_line.find("bond") != string::npos)
                 && (current_line.find("types") != string::npos))
            bond_types_line = iline;

         iline++;
      }
      data_file.close();

      /* Read the masses of the nodes from the corresponding session of the data file. */
      tokens = tokenize(lines_of_file[atom_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bead types: " << ihelp << " .\n";
      node_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++) {
         tokens = tokenize(lines_of_file[masses_line_start + i + 2]);
         node_types[i].n_mass = atof(tokens[1].c_str());
         node_types[i].mass = atof(tokens[2].c_str());

         tokens = tokenize(lines_of_file[pair_coeffs_line_start+i+2]);
         node_types[i].r_node = atof(tokens[1].c_str());
      }

      /* Read the bond coefficients from the corresponding section of the data file. */
      tokens = tokenize(lines_of_file[bond_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bond types: " << ihelp << " .\n";
      bond_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++){
         tokens = tokenize(lines_of_file[bond_coeffs_line_start + i + 2]);
         bond_types[i].spring_coeff = atof(tokens[1].c_str());
         bond_types[i].sq_ete = atof(tokens[2].c_str());
         bond_types[i].kuhnl = atof(tokens[3].c_str());
      }

      /* Read atom sections which corresponds to nodal points: */
      for (int i = 0; i < nnodes; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[atoms_line_start + 2 + i]);

         
         //int pbcx = atoi(tokens[7].c_str());
         //int pbcy = atoi(tokens[8].c_str());
         //int pbcz = atoi(tokens[9].c_str());
         
         /* Set the attributes of the current node object. */
         tNode current_node;
         current_node.Id = atoi(tokens[0].c_str());
         current_node.Type = atoi(tokens[2].c_str());
         current_node.Pos[0] = atof(tokens[4].c_str()); //+ (double)pbcx*netw_min->domain->XBoxLen;
         current_node.Pos[1] = atof(tokens[5].c_str()); //+ (double)pbcy*netw_min->domain->YBoxLen;
         current_node.Pos[2] = atof(tokens[6].c_str()); //+ (double)pbcz*netw_min->domain->ZBoxLen;
         current_node.node_cell = 0;

         // Read the mass of the nodal point from the "Masses" section of the file.
         current_node.n_mass = node_types[current_node.Type-1].n_mass;
         current_node.mass = node_types[current_node.Type-1].mass;

         /* Pair coeffs come from the data file in Angstrom. */
         current_node.r_node = node_types[current_node.Type-1].r_node;
         current_node.r_star = current_node.r_node;

         nodes.push_back(current_node);
      }
      cout << "#: --- " << nnodes << " nodes have been added to the network structure.\n";


      int nchains = 0;

      for (int i = 0; i < nstrands; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[bonds_line_start + 2 + i]);
         
         /* Create a temporary object: */
         tStrand current_strand;
         current_strand.Id = atoi(tokens[0].c_str());
         current_strand.Type = atoi(tokens[1].c_str());
         current_strand.OrChain = atoi(tokens[5].c_str());
         if (current_strand.OrChain > nchains)
            nchains = current_strand.OrChain;

         if (current_strand.OrChain == 0)
            current_strand.slip_spring = true;
         else
            current_strand.slip_spring = false;

         /* Read the tags of the start and the end of the strand. */
         int snode = atoi(tokens[2].c_str());
         int enode = atoi(tokens[3].c_str());

         if (snode > (nnodes) || enode > (nnodes)){
            cout << ": --- There is a problem at line: " << (bonds_line_start + 2 + i + 1) 
                 << " of the data file.\n" << lines_of_file[bonds_line_start + 2 + i] << "\n";
            exit(0);
         }
         
         /* We have to find the nodal point whose tag is equal to snode: */
         int found = 0;
         for (std::list <tNode>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
            if (found > 1)
               break;
            if ((*it).Id == snode || (*it).Id == enode) {
               found++;
               (*it).OrChains.push_back(current_strand.OrChain);
               current_strand.pEnds.push_back(&(*it));
            }
         }

         /* Spring coeffs comes from the data file in kJ/mol/K/A^2 */
         current_strand.spring_coeff = bond_types[current_strand.Type-1].spring_coeff;
         /* Length of the strand (n*b) comes from the data file in Angstroms. */
         current_strand.sq_end_to_end = bond_types[current_strand.Type-1].sq_ete;
         current_strand.kuhn_length = bond_types[current_strand.Type-1].kuhnl;

         /* Set the creation time of the slip-spring: */
         if (current_strand.slip_spring)
            current_strand.tcreation = 0;
         
         /* and push it back to the list: */
         strands.push_back(current_strand);

         /* 2013/04/09: Also, push back a pointer to the last element of "strands" vector, if 
          *             the inserted strand is a slip spring. */
         if (current_strand.slip_spring)
            pslip_springs.push_back(&(strands.back()));
      }



      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         /* 2013/04/09: We exclude slip strings from the local registry of strands connected to 
          *             a specific node. Array "pStrands" contains only chain strands, 
          *             not slip-springs!!. */
         if (!(*it).slip_spring) {
            (*it).pEnds[0]->pStrands.push_back(&(*it));
            (*it).pEnds[1]->pStrands.push_back(&(*it));
         }
      }

      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         if ((*it).slip_spring)
            continue;

         double dxr = (*it).pEnds[1]->Pos[0] - (*it).pEnds[0]->Pos[0];
         double dyr = (*it).pEnds[1]->Pos[1] - (*it).pEnds[0]->Pos[1];
         double dzr = (*it).pEnds[1]->Pos[2] - (*it).pEnds[0]->Pos[2];
         netw_min->domain->minimum_image(dxr, dyr, dzr);

         double dist = sqrt(dxr * dxr + dyr * dyr + dzr * dzr);
         if (dist - (*it).sq_end_to_end / (*it).kuhn_length > tol)
            cout << "Strand " << (*it).Id << " has length " << (*it).sq_end_to_end 
                  / (*it).kuhn_length << " but real dist " << dist << endl;

      }

      /* Categorize strands into chains: */
      std::vector<std::list<tStrand *> > chains(nchains);
      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it)
         if (!(*it).slip_spring)
            chains[(*it).OrChain - 1].push_back(&(*it));


      /* Loop over all chains: */
      sorted_chains.resize(nchains);

      for (unsigned int ich = 0; ich < chains.size(); ich++) {
         /* Search to find an end of the chain: */
         std::list <tStrand *>::iterator it, jt;
         jt = find_if(chains[ich].begin(), chains[ich].end(), pred_strand_is_end);
         if (jt == chains[ich].end()) {
            cout << "Chain with no ends was found: " << ich << " .\n";
            cout << "Number of strands: " << chains[ich].size() << " .\n";
            return;
         }

         if ((*jt)->pEnds[0]->Type != 1) {
            tNode *temp;
            temp = (*jt)->pEnds[0];
            (*jt)->pEnds[0] = (*jt)->pEnds[1];
            (*jt)->pEnds[1] = temp;
         }
         sorted_chains[ich].push_back((*jt));
         if (chains[ich].size() > 1)
            chains[ich].erase(jt);
         else
            continue;

         int nelems = chains[ich].size();
         for (int i = 0; i < nelems; i++) {
            /* Set the iterator to the end of the sorted list: */
            it = sorted_chains[ich].end();
            --it;

            /* Find the next element: */
            for (jt = chains[ich].begin(); jt != chains[ich].end(); ++jt) {
               /* check whether is connected to the preceeding strand: */
               if ((*jt)->pEnds[0] == (*it)->pEnds[1]) {
                  /* We can append the found strand as is: */
                  sorted_chains[ich].push_back((*jt));
                  /* an delete it from the previous list */
                  jt = chains[ich].erase(jt);
                  break;
               }

               if ((*jt)->pEnds[1] == (*it)->pEnds[1]) {
                  /* We have to change the order of the pointers. */
                  tNode *temp;
                  temp = (*jt)->pEnds[0];
                  (*jt)->pEnds[0] = (*jt)->pEnds[1];
                  (*jt)->pEnds[1] = temp;

                  /* And add it to the list: */
                  sorted_chains[ich].push_back((*jt));
                  jt = chains[ich].erase(jt);
                  break;
               }
            }
         }
      }


      return;
   }